

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

PAL_ERROR CorUnix::CPalSynchronizationManager::PrepareForShutdown(void)

{
  uint uVar1;
  int iVar2;
  CPalSynchronizationManager *this;
  CPalThread *pthrCurrent_00;
  int *piVar3;
  undefined1 local_40 [8];
  timespec tsAbsTmo;
  ThreadNativeWaitData *ptnwdWorkerThreadNativeData;
  int iRet;
  CPalThread *pthrCurrent;
  CPalSynchronizationManager *pSynchManager;
  LONG lInit;
  PAL_ERROR palErr;
  
  pSynchManager._4_4_ = 0;
  this = GetInstance();
  pthrCurrent_00 = InternalGetCurrentThread();
  memset(local_40,0,0x10);
  piVar3 = Volatile<int>::operator&((Volatile<int> *)&s_lInitStatus);
  uVar1 = InterlockedCompareExchange(piVar3,3,2);
  if (uVar1 == 2) {
    DiscardMonitoredProcesses(this,pthrCurrent_00);
    if (this->m_pipoThread != (IPalObject *)0x0) {
      pSynchManager._4_4_ = WakeUpLocalWorkerThread(this,SynchWorkerCmdShutdown);
      if (pSynchManager._4_4_ == 0) {
        tsAbsTmo.tv_nsec =
             (__syscall_slong_t)&(this->m_pthrWorker->synchronizationInfo).m_tnwdNativeData;
        pSynchManager._4_4_ = GetAbsoluteTimeout(2000,(timespec *)local_40);
        if (pSynchManager._4_4_ == 0) {
          iVar2 = pthread_mutex_lock((pthread_mutex_t *)tsAbsTmo.tv_nsec);
          if (iVar2 == 0) {
            ptnwdWorkerThreadNativeData._4_4_ = 0;
            do {
              if (*(int *)(tsAbsTmo.tv_nsec + 0x58) != 0) goto LAB_003bfaab;
              ptnwdWorkerThreadNativeData._4_4_ =
                   pthread_cond_timedwait
                             ((pthread_cond_t *)(tsAbsTmo.tv_nsec + 0x28),
                              (pthread_mutex_t *)tsAbsTmo.tv_nsec,(timespec *)local_40);
            } while (ptnwdWorkerThreadNativeData._4_4_ == 0);
            if (ptnwdWorkerThreadNativeData._4_4_ == 0x6e) {
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
            }
            else {
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
              piVar3 = __errno_location();
              strerror(*piVar3);
            }
LAB_003bfaab:
            if (ptnwdWorkerThreadNativeData._4_4_ == 0) {
              *(undefined4 *)(tsAbsTmo.tv_nsec + 0x58) = 0;
            }
            iVar2 = pthread_mutex_unlock((pthread_mutex_t *)tsAbsTmo.tv_nsec);
            if (iVar2 != 0) {
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
              pSynchManager._4_4_ = 0x54f;
              Volatile<int>::operator=((Volatile<int> *)&s_lInitStatus,5);
            }
          }
          else {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            pSynchManager._4_4_ = 0x54f;
            Volatile<int>::operator=((Volatile<int> *)&s_lInitStatus,5);
          }
        }
        else {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          Volatile<int>::operator=((Volatile<int> *)&s_lInitStatus,5);
        }
      }
      else {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        Volatile<int>::operator=((Volatile<int> *)&s_lInitStatus,5);
      }
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","PrepareForShutdown",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0x629);
    fprintf(_stderr,
            "Unexpected initialization status found in PrepareForShutdown [expected=%d current=%d]\n"
            ,2,(ulong)uVar1);
    pSynchManager._4_4_ = 0x54f;
  }
  if (pSynchManager._4_4_ == 0) {
    if (this->m_pipoThread != (IPalObject *)0x0) {
      (*this->m_pipoThread->_vptr_IPalObject[8])(this->m_pipoThread,pthrCurrent_00);
      this->m_pipoThread = (IPalObject *)0x0;
      this->m_pthrWorker = (CPalThread *)0x0;
    }
    Volatile<int>::operator=((Volatile<int> *)&s_lInitStatus,4);
  }
  return pSynchManager._4_4_;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::PrepareForShutdown()
    {
        PAL_ERROR palErr = NO_ERROR;
        LONG lInit;
        CPalSynchronizationManager * pSynchManager = GetInstance();
        CPalThread * pthrCurrent = InternalGetCurrentThread();
        int iRet;
        ThreadNativeWaitData * ptnwdWorkerThreadNativeData;
#if !SYNCHMGR_PIPE_BASED_THREAD_BLOCKING
        struct timespec tsAbsTmo = { 0, 0 };
#else // SYNCHMGR_PIPE_BASED_THREAD_BLOCKING
        DWORD dwOldTime = GetTickCount();
        DWORD dwTmo;
        int iPollTmo;
        int iEagains= 0;
        bool fAgain;
        struct pollfd pllfd;
#endif // SYNCHMGR_PIPE_BASED_THREAD_BLOCKING

        lInit = InterlockedCompareExchange(&s_lInitStatus,
            (LONG)SynchMgrStatusShuttingDown, (LONG)SynchMgrStatusRunning);

        if ((LONG)SynchMgrStatusRunning != lInit)
        {
            ASSERT("Unexpected initialization status found "
                   "in PrepareForShutdown [expected=%d current=%d]\n",
                   SynchMgrStatusRunning, lInit);
            // We intentionally not set s_lInitStatus to SynchMgrStatusError
            // cause this could interfere with a previous thread already
            // executing shutdown
            palErr = ERROR_INTERNAL_ERROR;
            goto PFS_exit;
        }

        // Discard process monitoring for process waits
        pSynchManager->DiscardMonitoredProcesses(pthrCurrent);

        if (NULL == pSynchManager->m_pipoThread)
        {
            // If m_pipoThread is NULL here, that means that StartWorker has
            // never been called. That may happen if PAL_Initialize fails
            // sometime after having called CreatePalSynchronizationManager,
            // but before calling StartWorker. Nothing else to do here.
            goto PFS_exit;
        }

        palErr = pSynchManager->WakeUpLocalWorkerThread(SynchWorkerCmdShutdown);
        if (NO_ERROR != palErr)
        {
            ERROR("Failed stopping worker thread [palErr=%u]\n", palErr);
            s_lInitStatus = SynchMgrStatusError;
            goto PFS_exit;
        }

        ptnwdWorkerThreadNativeData =
            &pSynchManager->m_pthrWorker->synchronizationInfo.m_tnwdNativeData;

#if !SYNCHMGR_PIPE_BASED_THREAD_BLOCKING
        palErr = GetAbsoluteTimeout(WorkerThreadTerminationTimeout, &tsAbsTmo);
        if (NO_ERROR != palErr)
        {
            ERROR("Failed to convert timeout to absolute timeout\n");
            s_lInitStatus = SynchMgrStatusError;
            goto PFS_exit;
        }

        // Using the worker thread's predicate/condition/mutex
        // to wait for worker thread to be done
        iRet = pthread_mutex_lock(&ptnwdWorkerThreadNativeData->mutex);
        if (0 != iRet)
        {
            // pthread calls might fail if the shutdown is called
            // from a signal handler. In this case just don't wait
            // for the worker thread
            ERROR("Cannot lock mutex [err=%d]\n", iRet);
            palErr = ERROR_INTERNAL_ERROR;
            s_lInitStatus = SynchMgrStatusError;
            goto PFS_exit;
        }

        while (FALSE == ptnwdWorkerThreadNativeData->iPred)
        {
            iRet = pthread_cond_timedwait(&ptnwdWorkerThreadNativeData->cond,
                                          &ptnwdWorkerThreadNativeData->mutex,
                                          &tsAbsTmo);
            if (0 != iRet)
            {
                if (ETIMEDOUT == iRet)
                {
                    WARN("Timed out waiting for worker thread to exit "
                         "(tmo=%u ms)\n", WorkerThreadTerminationTimeout);
                }
                else
                {
                    ERROR("pthread_cond_timedwait returned %d [errno=%d (%s)]\n",
                          iRet, errno, strerror(errno));
                }
                break;
            }
        }
        if (0 == iRet)
        {
            ptnwdWorkerThreadNativeData->iPred = FALSE;
        }
        iRet = pthread_mutex_unlock(&ptnwdWorkerThreadNativeData->mutex);
        if (0 != iRet)
        {
            ERROR("Cannot unlock mutex [err=%d]\n", iRet);
            palErr = ERROR_INTERNAL_ERROR;
            s_lInitStatus = SynchMgrStatusError;
            goto PFS_exit;
        }

#else // SYNCHMGR_PIPE_BASED_THREAD_BLOCKING

        dwTmo = min(WorkerThreadTerminationTimeout, INT_MAX);

        do
        {
            fAgain = false;

            pllfd.fd = ptnwdWorkerThreadNativeData->iPipeRd;
            pllfd.events = POLLIN;
            pllfd.revents = 0;
            iPollTmo = dwTmo;

            iRet = poll(&pllfd, 1, iPollTmo);

            switch(iRet)
            {
                case 0:
                    // Timeout
                    WARN("Timed out waiting for worker thread to exit "
                         "(tmo=%u ms)\n", WorkerThreadTerminationTimeout);
                    break;
                case 1:
                    // Signal
                    break;
                case -1:
                    if(EINTR == errno)
                    {
                        if (MaxWorkerConsecutiveEintrs >= ++iEagains)
                        {
                            fAgain = true;
                            UpdateTimeout(&dwOldTime, &dwTmo);
                        }
                        else
                        {
                            ERROR("Too many (%d) consecutive EAGAINs while polling "
                                  "pipe %d, waiting for worker thread to exit\n",
                                  iEagains, ptnwdWorkerThreadNativeData->iPipeRd);
                            palErr = ERROR_INTERNAL_ERROR;
                        }
                    }
                    else
                    {
                        ERROR("Unexpected errno=%d (%s) while polling pipe %d\n",
                              errno, strerror(errno),
                              ptnwdWorkerThreadNativeData->iPipeRd);
                        palErr = ERROR_INTERNAL_ERROR;
                    }
                    break;
                default:
                    // Error
                    ERROR("Unexpected return code %d while polling pipe %d\n",
                          iRet, ptnwdWorkerThreadNativeData->iPipeRd);
                    palErr = ERROR_INTERNAL_ERROR;
                    break;
            }
        } while (fAgain);

#endif // SYNCHMGR_PIPE_BASED_THREAD_BLOCKING

    PFS_exit:
        if (NO_ERROR == palErr)
        {
            if (NULL != pSynchManager->m_pipoThread)
            {
                pSynchManager->m_pipoThread->ReleaseReference(pthrCurrent);

                // After this release both m_pipoThread and m_pthrWorker
                // are no longer valid
                pSynchManager->m_pipoThread = NULL;
                pSynchManager->m_pthrWorker = NULL;
            }

            // Ready for process shutdown
            s_lInitStatus = SynchMgrStatusReadyForProcessShutDown;
        }

        return palErr;
    }